

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

void __thiscall
TadsHttpListenerThread::TadsHttpListenerThread
          (TadsHttpListenerThread *this,vm_obj_id_t srv_obj,TadsMessageQueue *q,long ulim)

{
  __int_type in_RCX;
  TadsMessageQueue *in_RDX;
  undefined4 in_ESI;
  OS_Event *in_RDI;
  TadsListenerThread *unaff_retaddr;
  OS_Event *quit_evt;
  
  quit_evt = in_RDI;
  TadsMessageQueue::get_quit_evt(in_RDX);
  TadsListenerThread::TadsListenerThread(unaff_retaddr,quit_evt);
  (in_RDI->super_CVmRefCntObj)._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsHttpListenerThread_0042c138;
  (in_RDI->cond).__align = (longlong)&DAT_0042c170;
  *(undefined4 *)&in_RDI[1].super_OS_Waitable._vptr_OS_Waitable = in_ESI;
  in_RDI[1].super_CVmRefCntObj._vptr_CVmRefCntObj = (_func_int **)in_RDX;
  CVmRefCntObj::add_ref((CVmRefCntObj *)0x25f4ba);
  in_RDI[1].super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i = in_RCX;
  return;
}

Assistant:

TadsHttpListenerThread::TadsHttpListenerThread(
    vm_obj_id_t srv_obj, TadsMessageQueue *q, long ulim)
    : TadsListenerThread(q->get_quit_evt())
{
    /* remember the HTTPServer object that created the listener */
    this->srv_obj = srv_obj;

    /* save a reference to the queue */
    (queue = q)->add_ref();

    /* save the upload limit */
    upload_limit = ulim;
}